

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcTiming.c
# Opt level: O0

void Abc_NtkTimeSetInputDrive(Abc_Ntk_t *pNtk,int PiNum,float Rise,float Fall)

{
  float fVar1;
  int iVar2;
  Abc_ManTime_t *pAVar3;
  Abc_Time_t *pAVar4;
  int local_2c;
  int i;
  Abc_Time_t *pTime;
  float Fall_local;
  float Rise_local;
  int PiNum_local;
  Abc_Ntk_t *pNtk_local;
  
  if ((-1 < PiNum) && (iVar2 = Abc_NtkCiNum(pNtk), PiNum < iVar2)) {
    if (pNtk->pManTime == (Abc_ManTime_t *)0x0) {
      pAVar3 = Abc_ManTimeStart(pNtk);
      pNtk->pManTime = pAVar3;
    }
    fVar1 = (pNtk->pManTime->tInDriveDef).Rise;
    if ((((fVar1 != Rise) || (NAN(fVar1) || NAN(Rise))) ||
        (fVar1 = (pNtk->pManTime->tInDriveDef).Fall, fVar1 != Fall)) || (NAN(fVar1) || NAN(Fall))) {
      if (pNtk->pManTime->tInDrive == (Abc_Time_t *)0x0) {
        iVar2 = Abc_NtkCiNum(pNtk);
        pAVar4 = (Abc_Time_t *)calloc((long)iVar2,8);
        pNtk->pManTime->tInDrive = pAVar4;
        for (local_2c = 0; iVar2 = Abc_NtkCiNum(pNtk), local_2c < iVar2; local_2c = local_2c + 1) {
          pNtk->pManTime->tInDrive[local_2c] = pNtk->pManTime->tInDriveDef;
        }
      }
      pAVar4 = pNtk->pManTime->tInDrive + PiNum;
      pAVar4->Rise = Rise;
      pAVar4->Fall = Fall;
    }
    return;
  }
  __assert_fail("PiNum >= 0 && PiNum < Abc_NtkCiNum(pNtk)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcTiming.c"
                ,0x122,"void Abc_NtkTimeSetInputDrive(Abc_Ntk_t *, int, float, float)");
}

Assistant:

void Abc_NtkTimeSetInputDrive( Abc_Ntk_t * pNtk, int PiNum, float Rise, float Fall )
{
    Abc_Time_t * pTime;
    assert( PiNum >= 0 && PiNum < Abc_NtkCiNum(pNtk) );
    if ( pNtk->pManTime == NULL )
        pNtk->pManTime = Abc_ManTimeStart(pNtk);
    if ( pNtk->pManTime->tInDriveDef.Rise == Rise && pNtk->pManTime->tInDriveDef.Fall == Fall )
        return;
    if ( pNtk->pManTime->tInDrive == NULL )
    {
        int i;
        pNtk->pManTime->tInDrive = ABC_CALLOC( Abc_Time_t, Abc_NtkCiNum(pNtk) );
        for ( i = 0; i < Abc_NtkCiNum(pNtk); i++ )
            pNtk->pManTime->tInDrive[i] = pNtk->pManTime->tInDriveDef;
    }
    pTime = pNtk->pManTime->tInDrive + PiNum;
    pTime->Rise  = Rise;
    pTime->Fall  = Fall;
}